

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenTrySetCatchTagAt(BinaryenExpressionRef expr,BinaryenIndex index,char *catchTag)

{
  Name *pNVar1;
  Name local_30;
  
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe7e,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  if ((ulong)index < *(ulong *)(expr + 3)) {
    if (catchTag != (char *)0x0) {
      wasm::Name::Name(&local_30,catchTag);
      pNVar1 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         ((ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name> *)&expr[2].type,
                          (ulong)index);
      (pNVar1->super_IString).str._M_len = local_30.super_IString.str._M_len;
      (pNVar1->super_IString).str._M_str = local_30.super_IString.str._M_str;
      return;
    }
    __assert_fail("catchTag",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xe80,
                  "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchTags.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe7f,
                "void BinaryenTrySetCatchTagAt(BinaryenExpressionRef, BinaryenIndex, const char *)")
  ;
}

Assistant:

void BinaryenTrySetCatchTagAt(BinaryenExpressionRef expr,
                              BinaryenIndex index,
                              const char* catchTag) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchTags.size());
  assert(catchTag);
  static_cast<Try*>(expression)->catchTags[index] = catchTag;
}